

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

OneHotLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_onehot(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x5aa) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5aa;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    OneHotLayerParams::OneHotLayerParams(this_00.onehot_);
    (this->layer_).onehot_ = (OneHotLayerParams *)this_00;
  }
  return (OneHotLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::OneHotLayerParams* NeuralNetworkLayer::mutable_onehot() {
  if (!has_onehot()) {
    clear_layer();
    set_has_onehot();
    layer_.onehot_ = new ::CoreML::Specification::OneHotLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.oneHot)
  return layer_.onehot_;
}